

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O3

ptr<buffer> __thiscall nuraft::cluster_config::serialize(cluster_config *this)

{
  size_t sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong *puVar2;
  ulong *in_RSI;
  ulong uVar3;
  long lVar4;
  ptr<buffer> pVar5;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  srv_buffs;
  ptr<buffer> buf;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_68;
  ulong *local_50;
  cluster_config *local_48;
  buffer *local_40;
  _Alloc_hider local_38;
  
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (ulong *)in_RSI[7];
  if (puVar2 == in_RSI + 7) {
    lVar4 = 0x19;
  }
  else {
    lVar4 = 0x15;
    local_50 = in_RSI;
    local_48 = this;
    do {
      srv_config::serialize((srv_config *)&local_40);
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      push_back(&local_68,(value_type *)&local_40);
      sVar1 = buffer::size(local_40);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p);
      }
      lVar4 = lVar4 + sVar1;
      puVar2 = (ulong *)*puVar2;
    } while (puVar2 != in_RSI + 7);
    lVar4 = lVar4 + 4;
    this = local_48;
    in_RSI = local_50;
  }
  buffer::alloc((buffer *)this,lVar4 + in_RSI[4]);
  buffer::put((buffer *)this->log_idx_,*in_RSI);
  buffer::put((buffer *)this->log_idx_,in_RSI[1]);
  buffer::put((buffer *)this->log_idx_,(byte)in_RSI[2]);
  buffer::put((buffer *)this->log_idx_,(byte *)in_RSI[3],in_RSI[4]);
  buffer::put((buffer *)this->log_idx_,(int32)in_RSI[9]);
  if (local_68.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      buffer::put((buffer *)this->log_idx_,
                  *(buffer **)
                   ((long)&((local_68.
                             super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)local_68.
                                   super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_68.
                                   super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  buffer::pos((buffer *)this->log_idx_,0);
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&local_68);
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> cluster_config::serialize() const {
    size_t sz = 2 * sz_ulong + sz_int + sz_byte;
    std::vector<ptr<buffer>> srv_buffs;
    for (auto it = servers_.cbegin(); it != servers_.cend(); ++it) {
        ptr<buffer> buf = (*it)->serialize();
        srv_buffs.push_back(buf);
        sz += buf->size();
    }
    // For aux string.
    sz += sz_int;
    sz += user_ctx_.size();

    ptr<buffer> result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((byte)(async_replication_ ? 1 : 0));
    result->put((byte*)user_ctx_.data(), user_ctx_.size());
    result->put((int32)servers_.size());
    for (size_t i = 0; i < srv_buffs.size(); ++i) {
        result->put(*srv_buffs[i]);
    }

    result->pos(0);
    return result;
}